

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

file_format_t __thiscall
cfgfile::details::determine_format_t<cfgfile::qstring_trait_t>::format
          (determine_format_t<cfgfile::qstring_trait_t> *this)

{
  char16_t cVar1;
  char cVar2;
  ulong in_RAX;
  wchar32 wVar3;
  char_t ch;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if (format()::xml == '\0') {
    format();
  }
  uStack_28 = uStack_28 & 0xffffffffffff;
  cVar2 = QTextStream::atEnd();
  if (cVar2 == '\0') {
    do {
      QTextStream::operator>>(this->m_stream,(QChar *)((long)&uStack_28 + 6));
      cVar1 = uStack_28._6_2_;
      if (((4 < (ushort)uStack_28._6_2_ - 9) && (uStack_28._6_2_ != L' ')) &&
         (((ushort)uStack_28._6_2_ < 0x80 ||
          (((wVar3 = (wchar32)(ushort)uStack_28._6_2_, wVar3 != L'\x85' && (wVar3 != L'\xa0')) &&
           (cVar2 = QChar::isSpace_helper(wVar3), cVar2 == '\0')))))) {
        return (uint)(cVar1 == format::xml.ucs);
      }
      cVar2 = QTextStream::atEnd();
    } while (cVar2 == '\0');
  }
  return cfgfile_format;
}

Assistant:

file_format_t format()
	{
		static const typename Trait::char_t xml = Trait::from_ascii( '<' );

		typename Trait::char_t ch( 0x00 );

		while( !Trait::is_at_end( m_stream ) )
		{
			m_stream >> ch;

			if( Trait::is_space( ch ) )
				continue;

			if( ch == xml )
				return file_format_t::xml_format;
			else
				return file_format_t::cfgfile_format;
		}

		return file_format_t::cfgfile_format;
	}